

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool __thiscall
Js::DebuggerScope::GetPropertyIndex(DebuggerScope *this,PropertyId propertyId,int *index)

{
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar1;
  DebuggerScopeProperty *pDVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  DebuggerScopeProperty *pDVar6;
  bool bVar7;
  
  pLVar1 = (this->scopeProperties).ptr;
  if ((pLVar1 == (List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)0x0) ||
     (uVar3 = (ulong)(pLVar1->
                     super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>
                     ).count, (long)uVar3 < 1)) {
    *index = -1;
    bVar7 = false;
  }
  else {
    lVar4 = 1;
    pDVar2 = (pLVar1->
             super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).
             buffer.ptr;
    do {
      pDVar6 = pDVar2;
      uVar5 = uVar3;
      if (uVar3 + lVar4 == 1) goto LAB_006d2631;
      lVar4 = lVar4 + -1;
      pDVar2 = pDVar6 + 1;
    } while (pDVar6->propId != propertyId);
    *index = pDVar6->location;
    uVar5 = -lVar4;
LAB_006d2631:
    bVar7 = uVar5 < uVar3;
  }
  return bVar7;
}

Assistant:

bool DebuggerScope::GetPropertyIndex(Js::PropertyId propertyId, int& index)
    {
        if (!this->HasProperties())
        {
            index = -1;
            return false;
        }

        bool found = this->scopeProperties->MapUntil( [&](int i, const DebuggerScopeProperty& scopeProperty) {
            if(scopeProperty.propId == propertyId)
            {
                index = scopeProperty.location;
                return true;
            }
            return false;
        });

        if(!found)
        {
            return false;
        }
        return true;
    }